

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_split.cc
# Opt level: O1

vector<absl::string_view,_std::allocator<absl::string_view>_> *
absl::StrSplit<absl::string_view>
          (vector<absl::string_view,_std::allocator<absl::string_view>_> *__return_storage_ptr__,
          string_view *text,char delim,function<bool_(absl::string_view)> *predicate)

{
  pointer *ppsVar1;
  iterator iVar2;
  bool bVar3;
  size_type sVar4;
  size_type sVar5;
  string_view view;
  string_view local_50;
  string_view local_40;
  
  (__return_storage_ptr__->super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar5 = 0;
  sVar4 = string_view::find(text,delim,0);
  if (sVar4 != 0xffffffffffffffff) {
    sVar5 = 0;
    do {
      local_50.ptr_ = text->ptr_ + sVar5;
      sVar5 = sVar4 - sVar5;
      if ((long)sVar5 < 0) {
        StrSplit<absl::string_view>();
        goto LAB_0023544b;
      }
      local_50.length_ = sVar5;
      local_40.ptr_ = local_50.ptr_;
      local_40.length_ = sVar5;
      if ((predicate->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00235450;
      bVar3 = (*predicate->_M_invoker)((_Any_data *)predicate,&local_40);
      if (bVar3) {
        iVar2._M_current =
             (__return_storage_ptr__->
             super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<absl::string_view,std::allocator<absl::string_view>>::
          _M_realloc_insert<absl::string_view&>
                    ((vector<absl::string_view,std::allocator<absl::string_view>> *)
                     __return_storage_ptr__,iVar2,&local_50);
        }
        else {
          (iVar2._M_current)->ptr_ = local_50.ptr_;
          (iVar2._M_current)->length_ = local_50.length_;
          ppsVar1 = &(__return_storage_ptr__->
                     super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppsVar1 = *ppsVar1 + 1;
        }
      }
      sVar5 = sVar4 + 1;
      sVar4 = string_view::find(text,delim,sVar5);
    } while (sVar4 != 0xffffffffffffffff);
  }
  local_50.ptr_ = text->ptr_ + sVar5;
  sVar5 = text->length_ - sVar5;
  if (-1 < (long)sVar5) {
    local_50.length_ = sVar5;
    local_40.ptr_ = local_50.ptr_;
    local_40.length_ = sVar5;
    if ((predicate->super__Function_base)._M_manager != (_Manager_type)0x0) {
      bVar3 = (*predicate->_M_invoker)((_Any_data *)predicate,&local_40);
      if (bVar3) {
        iVar2._M_current =
             (__return_storage_ptr__->
             super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<absl::string_view,std::allocator<absl::string_view>>::
          _M_realloc_insert<absl::string_view&>
                    ((vector<absl::string_view,std::allocator<absl::string_view>> *)
                     __return_storage_ptr__,iVar2,&local_50);
        }
        else {
          (iVar2._M_current)->ptr_ = local_50.ptr_;
          (iVar2._M_current)->length_ = local_50.length_;
          ppsVar1 = &(__return_storage_ptr__->
                     super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppsVar1 = *ppsVar1 + 1;
        }
      }
      return __return_storage_ptr__;
    }
    std::__throw_bad_function_call();
  }
LAB_0023544b:
  StrSplit<absl::string_view>();
LAB_00235450:
  std::__throw_bad_function_call();
}

Assistant:

vector<String> StrSplit(String const& text, char const delim,
                        function<bool(string_view)> predicate) {
  vector<String> elems;
  typename String::size_type begin = 0;
  typename String::size_type end;
  while ((end = text.find(delim, begin)) != String::npos) {
    string_view view(text.data() + begin, end - begin);
    if (predicate(view))
      elems.emplace_back(view);
    begin = end + 1;
  }
  // Try to add the portion after the last delim.
  string_view view(text.data() + begin, text.size() - begin);
  if (predicate(view))
    elems.emplace_back(view);
  return elems;
}